

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

void Col_ListIterBackward(ColListIterator *it,size_t nb)

{
  size_t nb_local;
  ColListIterator *it_local;
  
  if (nb != 0) {
    if (it->index < it->length) {
      if (it->index < nb) {
        (it->chunk).first = 0xffffffffffffffff;
        if (it->list == 0) {
          (it->chunk).last = it->index;
        }
        it->index = it->length;
      }
      else {
        it->index = it->index - nb;
        if (((it->chunk).first <= it->index) && (it->index <= (it->chunk).last)) {
          if ((it->chunk).accessProc == (undefined1 *)0x0) {
            if ((it->chunk).current.access.leaf != 0) {
              (it->chunk).current.direct = (it->chunk).current.direct + -nb;
            }
          }
          else {
            (it->chunk).current.access.index = (it->chunk).current.access.index - nb;
          }
        }
      }
    }
    else if (nb <= it->length) {
      if (it->list == 0) {
        it->index = (it->chunk).last;
        (it->chunk).first = 0;
        (it->chunk).last = it->length - 1;
        Col_ListIterMoveTo(it,it->length - nb);
      }
      else {
        it->index = it->length - nb;
      }
    }
  }
  return;
}

Assistant:

void
Col_ListIterBackward(
    Col_ListIterator it,    /*!< The iterator to move. */
    size_t nb)              /*!< Offset to move backward. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_LISTITER,it} */
    TYPECHECK_LISTITER(it) return;

    if (nb == 0) {
        /*
         * No-op.
         */

        return;
    }

    if (Col_ListIterEnd(it)) {
        /*
         * Allow iterators at end to go back.
         */

        if (nb > it->length) {
            /*
             * No-op.
             */

            return;
        }

        if (it->list == WORD_NIL) {
            /* 
             * Array iterator mode, restore previous position and move to the
             * new one (see Col_ListIterForward and below).
             */
            it->index = it->chunk.last;
            it->chunk.first = 0;
            it->chunk.last = it->length-1;
            Col_ListIterMoveTo(it, it->length-nb);
            return;
        }

        it->index = it->length-nb;
        return;
    } else if (it->index < nb) {
        /*
         * Beginning of list, set iterator at end.
         */

        it->chunk.first = SIZE_MAX; /* Invalidate traversal info. */
        if (it->list == WORD_NIL) {
            /* 
             * Array iterator mode, save current index for backward iteration
             * from end (see above).
             */
            it->chunk.last = it->index;
        }
        it->index = it->length;
        return;
    }

    it->index -= nb;
    if (it->index >= it->chunk.first && it->index <= it->chunk.last) {
        /*
         * Update current chunk pointer.
         */

        if (it->chunk.accessProc) it->chunk.current.access.index -= nb;
        else if (it->chunk.current.direct) it->chunk.current.direct -= nb;
    }
}